

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O0

OperationReturn __thiscall
FormatTypeRAW::GetFileListFromName
          (FormatTypeRAW *this,char *file_path,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *path;
  reference pbVar5;
  undefined1 local_1c0 [8];
  TrackItem item;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string file_formatted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directory_list;
  string dir_path;
  undefined1 local_b8 [4];
  undefined1 local_b4 [4];
  int side;
  int track;
  string last_part;
  string filename;
  string full_path;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list_1;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list_local;
  char *file_path_local;
  FormatTypeRAW *this_local;
  
  file_list_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)file_list;
  bVar1 = IsDirectory(file_path);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    GetDirectoryContent(file_path,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
  }
  else {
    GetFullPath_abi_cxx11_((string *)((long)&filename.field_2 + 8),file_path);
    GetFileFromPath_abi_cxx11_((string *)((long)&last_part.field_2 + 8),file_path);
    uVar3 = std::__cxx11::string::size();
    if (uVar3 < 9) {
      this_local._4_4_ = FILE_ERROR;
      bVar1 = true;
    }
    else {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&side,(ulong)((long)&last_part.field_2 + 8));
      uVar4 = std::__cxx11::string::c_str();
      iVar2 = __isoc99_sscanf(uVar4,"%i.%i.",local_b4,local_b8);
      if (iVar2 == 2) {
        GetDirectoryFromPath_abi_cxx11_
                  ((string *)
                   &directory_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,file_path);
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&file_formatted.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00);
        path = (char *)std::__cxx11::string::c_str();
        GetDirectoryContent(path,this_00);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_138,(ulong)((long)&filename.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"*.*.raw",(allocator<char> *)((long)&it._M_current + 7));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,&local_138,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
        std::__cxx11::string::~string((string *)&local_138);
        local_168._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&file_formatted.field_2 + 8));
        while( true ) {
          local_170._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&file_formatted.field_2 + 8));
          bVar1 = __gnu_cxx::operator!=(&local_168,&local_170);
          if (!bVar1) break;
          pbVar5 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_168);
          std::__cxx11::string::string
                    ((string *)(item.path.field_2._M_local_buf + 8),(string *)local_118);
          bVar1 = MatchTextWithWildcards(pbVar5,(string *)((long)&item.path.field_2 + 8));
          std::__cxx11::string::~string((string *)(item.path.field_2._M_local_buf + 8));
          if (bVar1) {
            FormatType::anon_struct_48_3_9b7c536b::TrackItem((anon_struct_48_3_9b7c536b *)local_1c0)
            ;
            local_1c0 = (undefined1  [8])0x0;
            item.buffer = (uchar *)0x0;
            pbVar5 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_168);
            std::__cxx11::string::operator=((string *)&item.size,(string *)pbVar5);
            std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::push_back
                      ((vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *)
                       file_list_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1c0);
            FormatType::anon_struct_48_3_9b7c536b::~TrackItem
                      ((anon_struct_48_3_9b7c536b *)local_1c0);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_168,0);
        }
        std::__cxx11::string::~string((string *)local_118);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&file_formatted.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)
                   &directory_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = false;
      }
      else {
        this_local._4_4_ = FILE_ERROR;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)&side);
      if (!bVar1) {
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)(last_part.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  return OK;
}

Assistant:

FormatTypeRAW::OperationReturn FormatTypeRAW::GetFileListFromName(const char* file_path,
                                                                  std::vector<TrackItem>& file_list)
{
#ifdef __MORPHOS__
   // Todo
   return -1;
#else

#endif

   // If file_path is a directory
   if (IsDirectory(file_path))
   {
      // walk the directory, 
      std::vector<std::string> file_list;
      GetDirectoryContent(file_path, file_list);

      // try to find pattern to get side / track
      // todo
      // fill the vector
   }
   else
   {
      // Otherwise, its a file : build a g�n�ric mask from this file
      std::string full_path = GetFullPath(file_path);
      std::string filename = GetFileFromPath(file_path);

      // Search for side / tracks. Filename should be of the form xxxx[track].[side].raw. Track si 00-41, side 0-1
      // Check last 8 characters
      if (filename.size() > 8)
      {
         std::string last_part = filename.substr(filename.size() - 8, 8);
         int track, side;
         if (sscanf(last_part.c_str(), "%i.%i.", &track, &side) != 2)
         {
            // Pattern not found
            return FILE_ERROR;
         }

         std::string dir_path = GetDirectoryFromPath(file_path);

         std::vector<std::string> directory_list;
         GetDirectoryContent(dir_path.c_str(), directory_list);

         std::string file_formatted = full_path.substr(0, full_path.size() - 8) + std::string("*.*.raw");

         for (auto it = directory_list.begin(); it != directory_list.end(); it++)
         {
            if (MatchTextWithWildcards(*it, file_formatted))
            {
               TrackItem item;
               item.buffer = nullptr;
               item.size = 0;
               item.path = *it;

               file_list.push_back(item);
            }
         }
      }
      else
      {
         // Not a regular RAW.... Will be hard to load !
         return FILE_ERROR;
      }


      // fill the vector
   }
   return OK;
}